

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

void __thiscall
soplex::LPRowSetBase<double>::add
          (LPRowSetBase<double> *this,DataKey *newkey,double *newlhs,
          SVectorBase<double> *newrowVector,double *newrhs,double *newobj,int *newscaleExp)

{
  int iVar1;
  int iVar2;
  VectorBase<double> *this_00;
  double *pdVar3;
  DataArray<int> *this_01;
  int *piVar4;
  double *in_RDX;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  int *in_stack_00000008;
  int in_stack_ffffffffffffff5c;
  DataArray<int> *in_stack_ffffffffffffff60;
  SVectorBase<double> *in_stack_ffffffffffffff70;
  DataKey *in_stack_ffffffffffffff78;
  double dVar5;
  SVSetBase<double> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  VectorBase<double> *in_stack_ffffffffffffff90;
  
  SVSetBase<double>::add
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  iVar1 = num((LPRowSetBase<double> *)0x2338c8);
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2338da);
  if (iVar2 < iVar1) {
    num((LPRowSetBase<double> *)0x2338fe);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x233927);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x233950);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPRowSetBase<double> *)0x233979);
    DataArray<int>::reSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  dVar5 = *in_RDX;
  this_00 = (VectorBase<double> *)(in_RDI + 0x68);
  num((LPRowSetBase<double> *)0x2339ad);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  dVar5 = *in_R8;
  num((LPRowSetBase<double> *)0x2339f0);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  dVar5 = *in_R9;
  num((LPRowSetBase<double> *)0x233a30);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  iVar1 = *in_stack_00000008;
  this_01 = (DataArray<int> *)(in_RDI + 0xb0);
  iVar2 = num((LPRowSetBase<double> *)0x233a6f);
  piVar4 = DataArray<int>::operator[](this_01,iVar2 + -1);
  *piVar4 = iVar1;
  return;
}

Assistant:

void add(DataKey& newkey, const R& newlhs, const SVectorBase<R>& newrowVector, const R& newrhs,
            const R& newobj = 0, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newrowVector);

      if(num() > left.dim())
      {
         left.reDim(num());
         right.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      left[num() - 1] = newlhs;
      right[num() - 1] = newrhs;
      object[num() - 1] = newobj;
      scaleExp[num() - 1] = newscaleExp;
   }